

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_test.cc
# Opt level: O1

void __thiscall
fizplex::SimplexTest_NonBindingRowFreeVarUnbounded_Test::
SimplexTest_NonBindingRowFreeVarUnbounded_Test(SimplexTest_NonBindingRowFreeVarUnbounded_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_SimplexTest).super_Test._vptr_Test = (_func_int **)&PTR__SimplexTest_001c4c60;
  LP::LP(&(this->super_SimplexTest).lp);
  DVector::DVector(&(this->super_SimplexTest).x,0);
  (this->super_SimplexTest).super_Test._vptr_Test = (_func_int **)&PTR__SimplexTest_001c49a0;
  return;
}

Assistant:

TEST_F(SimplexTest, NonBindingRowFreeVarUnbounded) {
  lp.add_column(ColType::Free, -inf, inf, 1);
  lp.add_row(RowType::NonBinding, -inf, inf, {1});

  solve_lp();
  EXPECT_EQ(Simplex::Result::Unbounded, result);
  EXPECT_TRUE(is_infinite(z));
  EXPECT_TRUE(is_le(z, 0));
  EXPECT_TRUE(is_infinite(x[0]));
}